

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit_p.cpp
# Opt level: O0

void QCalendarPopup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QCalendarPopup *_t;
  QDate in_stack_ffffffffffffff68;
  QDate in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch((QCalendarPopup *)(ulong)in_EDX) {
    case (QCalendarPopup *)0x0:
      activated((QCalendarPopup *)0x563b82,in_stack_ffffffffffffff68);
      break;
    case (QCalendarPopup *)0x1:
      newDateSelected((QCalendarPopup *)0x563bad,in_stack_ffffffffffffff68);
      break;
    case (QCalendarPopup *)0x2:
      hidingCalendar((QCalendarPopup *)0x563bcf,in_stack_ffffffffffffff68);
      break;
    case (QCalendarPopup *)0x3:
      resetButton((QCalendarPopup *)0x563bdb);
      break;
    case (QCalendarPopup *)0x4:
      dateSelected((QCalendarPopup *)in_stack_ffffffffffffff68.jd,in_stack_ffffffffffffff78);
      break;
    case (QCalendarPopup *)0x5:
      dateSelectionChanged((QCalendarPopup *)(ulong)in_EDX);
    }
  }
  if ((((in_ESI == 5) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QCalendarPopup::*)(QDate)>
                          (in_RCX,(void **)activated,0,0), !bVar2)) &&
      (bVar2 = QtMocHelpers::indexOfMethod<void(QCalendarPopup::*)(QDate)>
                         (in_RCX,(void **)newDateSelected,0,1), !bVar2)) &&
     (bVar2 = QtMocHelpers::indexOfMethod<void(QCalendarPopup::*)(QDate)>
                        (in_RCX,(void **)hidingCalendar,0,2), !bVar2)) {
    QtMocHelpers::indexOfMethod<void(QCalendarPopup::*)()>(in_RCX,(void **)resetButton,0,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarPopup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCalendarPopup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 1: _t->newDateSelected((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 2: _t->hidingCalendar((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->resetButton(); break;
        case 4: _t->dateSelected((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->dateSelectionChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::newDateSelected, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::hidingCalendar, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)()>(_a, &QCalendarPopup::resetButton, 3))
            return;
    }
}